

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O0

Gia_Man_t * Gia_ManFalseRebuildPath(Gia_Man_t *p,Vec_Int_t *vHooks,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  int iVar2;
  int iLit1;
  uint uVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  bool bVar7;
  int local_3c;
  int iPathEnd;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int fVeryVerbose_local;
  int fVerbose_local;
  Vec_Int_t *vHooks_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntEntryLast(vHooks);
  iVar2 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart((iVar2 << 2) / 3);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  Gia_ManFillValue(p);
  pGVar5 = Gia_ManConst0(p);
  pGVar5->Value = 0;
  Gia_ManHashAlloc(p_00);
  local_3c = 1;
  while( true ) {
    bVar7 = false;
    if (local_3c < p->nObjs) {
      _iPathEnd = Gia_ManObj(p,local_3c);
      bVar7 = _iPathEnd != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar2 = Gia_ObjIsAnd(_iPathEnd);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjIsCi(_iPathEnd);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjIsCo(_iPathEnd);
        if (iVar2 != 0) {
          iVar2 = Gia_ObjFanin0Copy(_iPathEnd);
          uVar3 = Gia_ManAppendCo(p_00,iVar2);
          _iPathEnd->Value = uVar3;
        }
      }
      else {
        uVar3 = Gia_ManAppendCi(p_00);
        _iPathEnd->Value = uVar3;
      }
    }
    else if (iVar1 == local_3c) {
      Gia_ManFalseRebuildOne(p_00,p,vHooks,fVerbose,fVeryVerbose);
    }
    else {
      iVar2 = Gia_ObjFanin0Copy(_iPathEnd);
      iLit1 = Gia_ObjFanin1Copy(_iPathEnd);
      uVar3 = Gia_ManHashAnd(p_00,iVar2,iLit1);
      _iPathEnd->Value = uVar3;
    }
    local_3c = local_3c + 1;
  }
  Gia_ManHashStop(p_00);
  iVar1 = Gia_ManRegNum(p);
  Gia_ManSetRegNum(p_00,iVar1);
  pGVar6 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManFalseRebuildPath( Gia_Man_t * p, Vec_Int_t * vHooks, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iPathEnd = Vec_IntEntryLast(vHooks);
    pNew = Gia_ManStart( 4 * Gia_ManObjNum(p) / 3 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( iPathEnd == i )
                Gia_ManFalseRebuildOne( pNew, p, vHooks, fVerbose, fVeryVerbose );
            else
                pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        }
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}